

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O0

qsizetype __thiscall
QStaticByteArrayMatcherBase::indexOfIn
          (QStaticByteArrayMatcherBase *this,char *needle,size_t nlen,char *haystack,qsizetype hlen,
          qsizetype from)

{
  qsizetype qVar1;
  uchar *in_RCX;
  qsizetype in_RDX;
  uchar *in_RSI;
  uchar *in_RDI;
  qsizetype in_R8;
  long in_R9;
  undefined8 local_30;
  
  local_30 = in_R9;
  if (in_R9 < 0) {
    local_30 = 0;
  }
  qVar1 = bm_find(in_RCX,in_R8,local_30,in_RSI,in_RDX,in_RDI);
  return qVar1;
}

Assistant:

qsizetype QStaticByteArrayMatcherBase::indexOfIn(const char *needle, size_t nlen, const char *haystack, qsizetype hlen, qsizetype from) const noexcept
{
    if (from < 0)
        from = 0;
    return bm_find(reinterpret_cast<const uchar *>(haystack), hlen, from,
                   reinterpret_cast<const uchar *>(needle),   nlen, m_skiptable.data);
}